

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::internal::parse_nonnegative_int<wchar_t>(wchar_t **s)

{
  int *piVar1;
  CStringRef message;
  FormatError *this;
  undefined8 *in_RDI;
  uint max_int;
  uint new_value;
  uint value;
  uint in_stack_ffffffffffffffd0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  BasicCStringRef<char> local_20;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_c = 0;
  do {
    piVar1 = (int *)*in_RDI;
    *in_RDI = piVar1 + 1;
    local_10 = local_c * 10 + *piVar1 + -0x30;
    if (local_10 < local_c) {
      local_c = std::numeric_limits<unsigned_int>::max();
      uVar2 = in_stack_ffffffffffffffd0;
      break;
    }
    uVar2 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (0x2f < *(int *)*in_RDI) {
      uVar2 = CONCAT13(*(int *)*in_RDI < 0x3a,(int3)in_stack_ffffffffffffffd0);
    }
    in_stack_ffffffffffffffd0 = uVar2;
    local_c = local_10;
  } while ((char)(uVar2 >> 0x18) != '\0');
  local_14 = std::numeric_limits<int>::max();
  if (local_14 < local_c) {
    this = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_20,"number is too big");
    message.data_._4_4_ = in_stack_ffffffffffffffd4;
    message.data_._0_4_ = uVar2;
    FormatError::FormatError(this,message);
    __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return local_c;
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  do {
    unsigned new_value = value * 10 + (*s++ - '0');
    // Check if value wrapped around.
    if (new_value < value) {
      value = (std::numeric_limits<unsigned>::max)();
      break;
    }
    value = new_value;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}